

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_position.c
# Opt level: O3

void verify_read_positions(archive *a)

{
  int iVar1;
  la_int64_t lVar2;
  size_t *psVar3;
  la_ssize_t v2;
  long v1;
  ulong uVar4;
  archive_entry *ae;
  archive_entry *local_38;
  
  lVar2 = archive_read_header_position(a);
  uVar4 = 0;
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_position.c"
                   ,L'*',(uint)(lVar2 == 0),
                   "read_position == (intmax_t)archive_read_header_position(a)",(void *)0x0);
  psVar3 = data_sizes;
  v1 = 0;
  do {
    iVar1 = archive_read_next_header(a,&local_38);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_position.c"
                     ,L',',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
    lVar2 = archive_read_header_position(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_position.c"
                        ,L'.',v1,"read_position",lVar2,"(intmax_t)archive_read_header_position(a)",
                        (void *)0x0);
    if ((uVar4 & 1) != 0) {
      v2 = archive_read_data(a,tmp,1);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_position.c"
                          ,L'2',1,"1",v2,"archive_read_data(a, tmp, 1)",(void *)0x0);
    }
    iVar1 = archive_read_data_skip(a);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_position.c"
                     ,L'3',(uint)(iVar1 == 0),"0 == archive_read_data_skip(a)",a);
    lVar2 = archive_read_header_position(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_position.c"
                        ,L'6',v1,"read_position",lVar2,"(intmax_t)archive_read_header_position(a)",
                        (void *)0x0);
    v1 = v1 + (*psVar3 + 0x1ff & 0xfffffffffffffe00) + 0x200;
    uVar4 = uVar4 + 1;
    psVar3 = psVar3 + 1;
  } while (uVar4 != 5);
  iVar1 = archive_read_next_header(a,&local_38);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_position.c"
                   ,L'<',(uint)(iVar1 == 1),"1 == archive_read_next_header(a, &ae)",a);
  lVar2 = archive_read_header_position(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_position.c"
                      ,L'=',0x1400,"read_position",lVar2,"(intmax_t)archive_read_header_position(a)"
                      ,(void *)0x0);
  iVar1 = archive_read_close(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_position.c"
                      ,L'>',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a);
  lVar2 = archive_read_header_position(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_position.c"
                      ,L'?',0x1400,"read_position",lVar2,"(intmax_t)archive_read_header_position(a)"
                      ,(void *)0x0);
  return;
}

Assistant:

static void
verify_read_positions(struct archive *a)
{
	struct archive_entry *ae;
	intmax_t read_position = 0;
	size_t j;

	/* Initial header position is zero. */
	assert(read_position == (intmax_t)archive_read_header_position(a));
	for (j = 0; j < sizeof(data_sizes)/sizeof(data_sizes[0]); ++j) {
		assertA(0 == archive_read_next_header(a, &ae));
		assertEqualInt(read_position,
		    (intmax_t)archive_read_header_position(a));
		/* Every other entry: read, then skip */
		if (j & 1)
			assertEqualInt(1,
			    archive_read_data(a, tmp, 1));
		assertA(0 == archive_read_data_skip(a));
		/* read_data_skip() doesn't change header_position */
		assertEqualInt(read_position,
		    (intmax_t)archive_read_header_position(a));

		read_position += 512; /* Size of header. */
		read_position += (data_sizes[j] + 511) & ~511;
	}

	assertA(1 == archive_read_next_header(a, &ae));
	assertEqualInt(read_position, (intmax_t)archive_read_header_position(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(read_position, (intmax_t)archive_read_header_position(a));
}